

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QSettingsGroup>::eraseLast(QGenericArrayOps<QSettingsGroup> *this)

{
  qsizetype *pqVar1;
  
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             ((this->super_QArrayDataPointer<QSettingsGroup>).ptr +
             (this->super_QArrayDataPointer<QSettingsGroup>).size + -1));
  pqVar1 = &(this->super_QArrayDataPointer<QSettingsGroup>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }